

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

bool __thiscall SimpleString::equalsNoCase(SimpleString *this,SimpleString *str)

{
  bool bVar1;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString *local_18;
  SimpleString *str_local;
  SimpleString *this_local;
  
  local_18 = str;
  str_local = this;
  lowerCase(&local_28);
  lowerCase(&local_38);
  bVar1 = operator==(&local_28,&local_38);
  ~SimpleString(&local_38);
  ~SimpleString(&local_28);
  return bVar1;
}

Assistant:

bool SimpleString::equalsNoCase(const SimpleString& str) const
{
    return lowerCase() == str.lowerCase();
}